

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O3

void __thiscall duckdb::MetadataReader::ReadNextBlock(MetadataReader *this)

{
  MetadataPointer MVar1;
  vector<duckdb::MetaBlockPointer,std::allocator<duckdb::MetaBlockPointer>> *this_00;
  iterator __position;
  BlockManager *pBVar2;
  MetadataPointer *pMVar3;
  MetadataPointer MVar4;
  idx_t iVar5;
  idx_t iVar6;
  IOException *this_01;
  InternalException *this_02;
  undefined8 extraout_RDX;
  ulong uVar7;
  MetaBlockPointer pointer;
  MetaBlockPointer next_block_pointer;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if (this->has_next_block == false) {
    this_01 = (IOException *)__cxa_allocate_exception(0x10);
    local_48._0_8_ = local_38;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"No more data remaining in MetadataReader","");
    IOException::IOException(this_01,(string *)local_48);
    __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  MetadataManager::Pin((MetadataHandle *)local_48,this->manager,&this->next_pointer);
  (this->block).pointer = (MetadataPointer)local_48._0_8_;
  BufferHandle::operator=(&(this->block).handle,(BufferHandle *)(local_48 + 8));
  BufferHandle::~BufferHandle((BufferHandle *)(local_48 + 8));
  this->index = (ulong)(byte)(this->next_pointer).field_0x7;
  pMVar3 = (MetadataPointer *)BasePtr(this);
  MVar1 = *pMVar3;
  if (MVar1 == (MetadataPointer)0xffffffffffffffff) {
    this->has_next_block = false;
  }
  else {
    pointer.offset = (int)extraout_RDX;
    pointer.unused_padding = (int)((ulong)extraout_RDX >> 0x20);
    pointer.block_pointer = (idx_t)MVar1;
    MVar4 = FromDiskPointer(this,pointer);
    this->next_pointer = MVar4;
    local_48._8_8_ = (element_type *)0x0;
    local_48._0_8_ = MVar1;
    if ((this->read_pointers).ptr != (vector<duckdb::MetaBlockPointer,_true> *)0x0) {
      optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>::CheckValid
                (&this->read_pointers);
      this_00 = (vector<duckdb::MetaBlockPointer,std::allocator<duckdb::MetaBlockPointer>> *)
                (this->read_pointers).ptr;
      __position._M_current = *(MetaBlockPointer **)(this_00 + 8);
      if (__position._M_current == *(MetaBlockPointer **)(this_00 + 0x10)) {
        ::std::vector<duckdb::MetaBlockPointer,std::allocator<duckdb::MetaBlockPointer>>::
        _M_realloc_insert<duckdb::MetaBlockPointer_const&>
                  (this_00,__position,(MetaBlockPointer *)local_48);
      }
      else {
        (__position._M_current)->block_pointer = local_48._0_8_;
        (__position._M_current)->offset = local_48._8_4_;
        (__position._M_current)->unused_padding = local_48._12_4_;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
    }
  }
  uVar7 = this->next_offset;
  if (uVar7 < 8) {
    this->next_offset = 8;
    uVar7 = 8;
  }
  pBVar2 = this->manager->block_manager;
  iVar5 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar6 = optional_idx::GetIndex(&pBVar2->block_header_size);
  if (uVar7 <= (iVar5 - iVar6 >> 6 & 0xfffffffffffffff8)) {
    this->offset = this->next_offset;
    this->next_offset = 8;
    pBVar2 = this->manager->block_manager;
    iVar5 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
    iVar6 = optional_idx::GetIndex(&pBVar2->block_header_size);
    this->capacity = iVar5 - iVar6 >> 6 & 0x3fffffffffffff8;
    return;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._0_8_ = local_38;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"next_offset cannot be bigger than block size","");
  InternalException::InternalException(this_02,(string *)local_48);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MetadataReader::ReadNextBlock() {
	if (!has_next_block) {
		throw IOException("No more data remaining in MetadataReader");
	}
	block = manager.Pin(next_pointer);
	index = next_pointer.index;

	idx_t next_block = Load<idx_t>(BasePtr());
	if (next_block == idx_t(-1)) {
		has_next_block = false;
	} else {
		next_pointer = FromDiskPointer(MetaBlockPointer(next_block, 0));
		MetaBlockPointer next_block_pointer(next_block, 0);
		if (read_pointers) {
			read_pointers->push_back(next_block_pointer);
		}
	}
	if (next_offset < sizeof(block_id_t)) {
		next_offset = sizeof(block_id_t);
	}
	if (next_offset > GetMetadataManager().GetMetadataBlockSize()) {
		throw InternalException("next_offset cannot be bigger than block size");
	}
	offset = next_offset;
	next_offset = sizeof(block_id_t);
	capacity = GetMetadataManager().GetMetadataBlockSize();
}